

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  stbi__write_context *s_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  undefined4 in_register_00000034;
  uchar *d;
  size_t __n;
  void *__s1;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ulong in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee8;
  uchar header;
  uchar header_1;
  stbi__write_context *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  int local_80;
  int local_7c;
  void *local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar5 = (ulong)(uint)comp;
  uVar4 = (uint)((comp - 2U & 0xfffffffd) == 0);
  local_98 = (ulong)uVar4;
  iVar1 = comp - uVar4;
  if ((y | x) < 0) {
    iVar1 = 0;
  }
  else {
    uVar8 = (ulong)(uint)x;
    local_a8 = s;
    local_78 = data;
    if (stbi_write_tga_with_rle == 0) {
      iVar1 = stbiw__outfile(s,x,uVar4,x,y,comp,0,data,uVar4,0,"111 221 2222 11",0,0,iVar1 < 2 | 2,0
                             ,0,0,0,0,x,y,(iVar1 + uVar4) * 8,uVar4 * 8);
    }
    else {
      d = (uchar *)0x0;
      stbiw__writef(s,(char *)CONCAT44(in_register_00000034,x),0,0,(ulong)(iVar1 < 2 | 10),0,0,
                    in_stack_fffffffffffffed0 & 0xffffffff00000000,0,0,
                    CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),x),y,
                    (iVar1 + uVar4) * 8,uVar4 * 8);
      iVar1 = y + -1;
      if (stbi__flip_vertically_on_write != 0) {
        iVar1 = 0;
      }
      local_58 = (ulong)(stbi__flip_vertically_on_write != 0) * 2 + -1;
      local_80 = comp * x;
      local_7c = x + -1;
      __n = (size_t)comp;
      local_68 = (long)x;
      local_50 = (long)(int)(-(uint)(stbi__flip_vertically_on_write == 0) | y);
      iVar2 = iVar1 * local_80;
      local_60 = (ulong)(uint)((int)local_58 * local_80);
      local_a0 = uVar8;
      local_90 = uVar5;
      for (local_38 = (long)iVar1; iVar1 = 1, local_38 != local_50; local_38 = local_38 + local_58)
      {
        local_48 = (long)iVar2;
        local_40 = (long)(local_80 * (int)local_38) + (long)local_78;
        local_88 = local_48 + (long)local_78;
        local_70 = 0;
        while (iVar1 = (int)local_70, iVar1 < (int)uVar8) {
          iVar2 = (int)uVar5;
          uVar4 = 1;
          if (iVar1 < local_7c) {
            __s1 = (void *)(local_40 + iVar1 * iVar2);
            iVar3 = bcmp(__s1,(void *)((iVar1 + 1) * iVar2 + local_40),__n);
            lVar9 = (long)(iVar1 + 2);
            if (iVar3 != 0) {
              pvVar6 = (void *)(__n * lVar9 + local_88);
              uVar4 = 2;
              while( true ) {
                uVar5 = local_90;
                uVar8 = local_a0;
                if ((local_68 <= lVar9) || (0x7f < uVar4)) goto LAB_00137307;
                iVar3 = bcmp(__s1,pvVar6,__n);
                if (iVar3 == 0) break;
                __s1 = (void *)((long)__s1 + __n);
                uVar4 = uVar4 + 1;
                lVar9 = lVar9 + 1;
                pvVar6 = (void *)((long)pvVar6 + __n);
              }
              uVar4 = uVar4 - 1;
              uVar5 = local_90;
              uVar8 = local_a0;
              goto LAB_00137307;
            }
            pvVar6 = (void *)(__n * lVar9 + local_88);
            uVar4 = 2;
            while (((lVar9 < local_68 && (uVar4 < 0x80)) &&
                   (iVar1 = bcmp(__s1,pvVar6,__n), iVar1 == 0))) {
              uVar4 = uVar4 + 1;
              lVar9 = lVar9 + 1;
              pvVar6 = (void *)((long)pvVar6 + __n);
            }
            s_00 = local_a8;
            header = (char)uVar4 + '\x7f';
            (*local_a8->func)(local_a8->context,&header,1);
            stbiw__write_pixel(s_00,iVar2,(int)local_98,0,(int)__s1,d);
            uVar8 = local_a0;
          }
          else {
LAB_00137307:
            header_1 = (char)uVar4 + 0xff;
            (*local_a8->func)(local_a8->context,&header_1,1);
            uVar7 = (ulong)uVar4;
            lVar9 = iVar1 * iVar2 + local_88;
            while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
              stbiw__write_pixel(local_a8,(int)uVar5,(int)local_98,0,(int)lVar9,d);
              lVar9 = lVar9 + __n;
            }
          }
          local_70 = (ulong)(uVar4 + (int)local_70);
        }
        iVar2 = (int)local_60 + (int)local_48;
      }
    }
  }
  return iVar1;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               s->func(s->context, &header, 1);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               s->func(s->context, &header, 1);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
   }
   return 1;
}